

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_9a8b::MemoryMappedFileTest_DoubleMap_Test::TestBody
          (MemoryMappedFileTest_DoubleMap_Test *this)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  StringRef data;
  StringRef data_00;
  ReturnSentinel gtest_sentinel;
  File file2;
  File file1;
  MemoryMappedFile<fmt::File> f;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  undefined1 local_f0 [16];
  string filename1;
  string filename2;
  
  (anonymous_namespace)::GetExecutableDir_abi_cxx11_();
  std::operator+(&filename1,&filename2,"/test1");
  std::__cxx11::string::~string((string *)&filename2);
  data.size_ = 3;
  data.data_ = "abc";
  WriteFile((CStringRef)filename1._M_dataplus._M_p,data);
  f.super_MemoryMappedFileBase.start_ = (char *)0x0;
  f.super_MemoryMappedFileBase.size_ = 0;
  fmt::File::File(&file1,(CStringRef)filename1._M_dataplus._M_p,0);
  sVar5 = fmt::File::size(&file1);
  mp::MemoryMappedFile<fmt::File>::map(&f,&file1,sVar5);
  (anonymous_namespace)::GetExecutableDir_abi_cxx11_();
  std::operator+(&filename2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1,
                 "/test2");
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  data_00.size_ = 4;
  data_00.data_ = "defg";
  WriteFile((CStringRef)filename2._M_dataplus._M_p,data_00);
  fmt::File::File(&file2,(CStringRef)filename2._M_dataplus._M_p,0);
  sVar5 = fmt::File::size(&file2);
  mp::MemoryMappedFile<fmt::File>::map(&f,&file2,sVar5);
  gtest_ar_1._0_8_ = local_f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar_1,f.super_MemoryMappedFileBase.start_,
             f.super_MemoryMappedFileBase.start_ + 4);
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"defg\"","std::string(f.start(), 4)",(char (*) [5])"defg",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/os-test.cc",0x106,
               pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_sentinel,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_sentinel.test_._0_4_ = 4;
  gtest_ar._0_8_ = f.super_MemoryMappedFileBase.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar_1,"4u","f.size()",(uint *)&gtest_sentinel,
             (unsigned_long *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/os-test.cc",0x107,
               pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)&gtest_ar)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  fmt::File::~File(&file2);
  std::__cxx11::string::~string((string *)&filename2);
  fmt::File::~File(&file1);
  mp::internal::MemoryMappedFileBase::~MemoryMappedFileBase(&f.super_MemoryMappedFileBase);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::RE::Init((RE *)&filename2,"");
    bVar2 = testing::internal::DeathTest::Create
                      ("(void)*start",(RE *)&filename2,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/os-test.cc"
                       ,0x109,(DeathTest **)&f);
    if (bVar2) {
      if (f.super_MemoryMappedFileBase.start_ != (char *)0x0) {
        gtest_ar._0_8_ = f.super_MemoryMappedFileBase.start_;
        iVar4 = (**(code **)(*(long *)f.super_MemoryMappedFileBase.start_ + 0x10))();
        pcVar6 = f.super_MemoryMappedFileBase.start_;
        if (iVar4 == 0) {
          iVar4 = (**(code **)(*(long *)f.super_MemoryMappedFileBase.start_ + 0x18))
                            (f.super_MemoryMappedFileBase.start_);
          bVar2 = testing::internal::ExitedUnsuccessfully(iVar4);
          cVar3 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,bVar2);
          if (cVar3 != '\0') goto LAB_0010fbb5;
          bVar2 = true;
          bVar1 = false;
        }
        else {
          if (iVar4 == 1) {
            gtest_sentinel.test_ = (DeathTest *)f.super_MemoryMappedFileBase.start_;
            testing::internal::AlwaysTrue();
            (**(code **)(*(long *)f.super_MemoryMappedFileBase.start_ + 0x28))
                      (f.super_MemoryMappedFileBase.start_,2);
            testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
          }
LAB_0010fbb5:
          bVar2 = false;
          bVar1 = true;
        }
        testing::internal::scoped_ptr<testing::internal::DeathTest>::~scoped_ptr
                  ((scoped_ptr<testing::internal::DeathTest> *)&gtest_ar);
        if (!bVar1) goto LAB_0010fbcb;
      }
      bVar2 = false;
    }
    else {
      bVar2 = true;
    }
LAB_0010fbcb:
    testing::internal::RE::~RE((RE *)&filename2);
    if (!bVar2) goto LAB_0010fc27;
  }
  testing::Message::Message((Message *)&filename2);
  pcVar6 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/os-test.cc",0x109,
             pcVar6);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&filename2);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&filename2);
LAB_0010fc27:
  std::__cxx11::string::~string((string *)&filename1);
  return;
}

Assistant:

TEST(MemoryMappedFileTest, DoubleMap) {
  std::string filename1 = GetExecutableDir() + "/test1";
  WriteFile(filename1, "abc");
  const volatile char *start = 0;
  {
    MemoryMappedFile<> f;
    File file1(filename1, File::RDONLY);
    f.map(file1, static_cast<std::size_t>(file1.size()));
    std::string filename2 = GetExecutableDir() + "/test2";
    WriteFile(filename2, "defg");
    File file2(filename2, File::RDONLY);
    f.map(file2, static_cast<std::size_t>(file2.size()));
    start = f.start();
    EXPECT_EQ("defg", std::string(f.start(), 4));
    EXPECT_EQ(4u, f.size());
  }
  EXPECT_DEATH((void)*start, "");
}